

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::readHeader
          (HttpInputStreamImpl *this,HeaderType type,size_t bufferStart,size_t bufferEnd)

{
  Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *this_00;
  PromiseAwaiter<unsigned_long> *__return_storage_ptr__;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *value_00;
  ulong *puVar1;
  ulong *puVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *this_01;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *other_00;
  uint uVar3;
  uint uVar4;
  FixVoid<unsigned_long> value_01;
  long lVar5;
  size_t count;
  SourceLocation location;
  coroutine_handle<void> handle;
  unsigned_long uVar6;
  void *pvVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  undefined4 in_register_00000034;
  undefined8 in_R8;
  long lVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *pFVar16;
  unsigned_long uVar17;
  ulong uVar18;
  bool bVar20;
  long lStackY_260;
  Fault f;
  unsigned_long uVar19;
  
  uVar6 = bufferStart & 0xffffffff;
  handle._M_fr_ptr = operator_new(0x560);
  *(code **)handle._M_fr_ptr = readHeader;
  *(code **)((long)handle._M_fr_ptr + 8) = readHeader;
  this_00 = (Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
            ((long)handle._M_fr_ptr + 0x10);
  *(int *)((long)handle._M_fr_ptr + 0x558) = (int)bufferStart;
  *(ulong *)((long)handle._M_fr_ptr + 0x548) = CONCAT44(in_register_00000034,type);
  *(size_t *)((long)handle._M_fr_ptr + 0x520) = bufferEnd;
  *(undefined8 *)((long)handle._M_fr_ptr + 0x528) = in_R8;
  f.exception = (Exception *)anon_var_dwarf_67f91a;
  location.function = "readHeader";
  location.fileName =
       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
  ;
  location.lineNumber = 0x6bb;
  location.columnNumber = 0x4a;
  kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::Coroutine
            (this_00,handle,location);
  kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::
  get_return_object((Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
                    this);
  __return_storage_ptr__ = (PromiseAwaiter<unsigned_long> *)((long)handle._M_fr_ptr + 0x278);
  value = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
          ((long)handle._M_fr_ptr + 0x438);
  value_00 = (FixVoid<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_> *)
             ((long)handle._M_fr_ptr + 0x478);
  puVar1 = (ulong *)((long)handle._M_fr_ptr + 0x520);
  puVar2 = (ulong *)((long)handle._M_fr_ptr + 0x528);
  this_01 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x530);
  other = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x538);
  other_00 = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)((long)handle._M_fr_ptr + 0x540);
  do {
    *(unsigned_long *)((long)handle._M_fr_ptr + 0x550) = uVar6;
    lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
    *(undefined8 *)((long)handle._M_fr_ptr + 0x530) = 0;
    value_01 = *(FixVoid<unsigned_long> *)(lVar13 + 0x40);
    if (value_01 == 0) {
      uVar18 = *puVar2;
      uVar10 = *(ulong *)(lVar13 + 0x20);
      if (uVar18 != uVar10) {
LAB_0030e962:
        uVar10 = uVar10 - uVar18;
        if (*(int *)((long)handle._M_fr_ptr + 0x558) == 1) {
          uVar11 = uVar18 - *(long *)((long)handle._M_fr_ptr + 0x520);
          *(ulong *)((long)handle._M_fr_ptr + 0x4e0) = uVar11;
          *(undefined8 **)((long)handle._M_fr_ptr + 0x4e8) =
               &(anonymous_namespace)::MAX_CHUNK_HEADER_SIZE;
          *(char **)((long)handle._M_fr_ptr + 0x4f0) = " <= ";
          *(undefined8 *)((long)handle._M_fr_ptr + 0x4f8) = 5;
          *(bool *)((long)handle._M_fr_ptr + 0x500) = uVar11 < 0x21;
          if (uVar11 >= 0x21) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long_const&>&,char_const(&)[24]>
                      (&f,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                       ,0x6fe,FAILED,"bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE",
                       "_kjCondition,\"invalid HTTP chunk size\"",
                       (DebugComparison<unsigned_long,_const_unsigned_long_&> *)
                       ((long)handle._M_fr_ptr + 0x4e0),(char (*) [24])"invalid HTTP chunk size");
            kj::_::Debug::Fault::fatal(&f);
          }
          if (0x1f < uVar10) {
            uVar10 = 0x20;
          }
        }
LAB_0030ead3:
        (**(code **)**(undefined8 **)(lVar13 + 0x10))
                  (other_00,*(undefined8 **)(lVar13 + 0x10),uVar18 + *(long *)(lVar13 + 0x18),1,
                   uVar10);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(this_01,other_00);
        Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(other_00);
        goto LAB_0030eb08;
      }
      uVar3 = *(uint *)((long)handle._M_fr_ptr + 0x558);
      if (uVar3 == 0) {
        uVar10 = 0;
      }
      else {
        uVar10 = *(ulong *)(lVar13 + 0x30);
      }
      uVar11 = *(ulong *)((long)handle._M_fr_ptr + 0x520);
      if (uVar10 < uVar11) {
        memmove((void *)(*(long *)(lVar13 + 0x18) + uVar10),
                (void *)(*(long *)(lVar13 + 0x18) + uVar11),uVar18 - uVar11);
        uVar18 = (*(long *)((long)handle._M_fr_ptr + 0x528) + uVar10) -
                 *(long *)((long)handle._M_fr_ptr + 0x520);
        *(ulong *)((long)handle._M_fr_ptr + 0x528) = uVar18;
        *(ulong *)((long)handle._M_fr_ptr + 0x520) = uVar10;
        lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
        uVar10 = *(ulong *)(lVar13 + 0x20);
        goto LAB_0030e962;
      }
      if (uVar3 != 0) {
        kj::_::Debug::makeDescription<char_const(&)[24]>
                  ((String *)((long)handle._M_fr_ptr + 0x508),(Debug *)0x43c026,
                   "invalid HTTP chunk size",(char (*) [24])(ulong)uVar3);
        Exception::Exception
                  ((Exception *)&f,FAILED,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x6e7,(String *)((long)handle._M_fr_ptr + 0x508));
        throwFatalException((Exception *)&f,0);
      }
      if (uVar18 < 0x20000) {
        pcVar9 = kj::_::HeapArrayDisposer::allocate<char>(uVar18 * 2);
        lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
        *(char **)((long)handle._M_fr_ptr + 0x278) = pcVar9;
        *(ulong *)((long)handle._M_fr_ptr + 0x280) = uVar18 * 2;
        *(undefined8 **)((long)handle._M_fr_ptr + 0x288) = &kj::_::HeapArrayDisposer::instance;
        memcpy(pcVar9,*(void **)(lVar13 + 0x18),*(size_t *)(lVar13 + 0x20));
        Array<char>::operator=((Array<char> *)(lVar13 + 0x18),(Array<char> *)__return_storage_ptr__)
        ;
        lVar12 = *(long *)((long)handle._M_fr_ptr + 0x548);
        Array<char>::~Array((Array<char> *)__return_storage_ptr__);
        uVar18 = *(ulong *)((long)handle._M_fr_ptr + 0x528);
        lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
        uVar10 = *(long *)(lVar12 + 0x20) - uVar18;
        goto LAB_0030ead3;
      }
      *(undefined8 *)((long)handle._M_fr_ptr + 0x468) = 0;
      *(undefined8 *)((long)handle._M_fr_ptr + 0x470) = 0;
      *(undefined4 *)((long)handle._M_fr_ptr + 0x438) = 2;
      *(undefined4 *)((long)handle._M_fr_ptr + 0x440) = 0x1af;
      *(char **)((long)handle._M_fr_ptr + 0x448) = "Request Header Fields Too Large";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x450) = 0x20;
      *(char **)((long)handle._M_fr_ptr + 0x458) = "header too large.";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x460) = 0x12;
      kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                (this_00,value);
      uVar4 = value->tag;
      pFVar16 = value;
LAB_0030ece2:
      if (uVar4 - 1 < 2) {
        pFVar16->tag = 0;
      }
      iVar14 = 3;
    }
    else {
      bVar20 = *(long *)((long)handle._M_fr_ptr + 0x520) ==
               *(long *)((long)handle._M_fr_ptr + 0x528);
      *(ulong **)((long)handle._M_fr_ptr + 0x4b8) = puVar1;
      *(ulong **)((long)handle._M_fr_ptr + 0x4c0) = puVar2;
      *(char **)((long)handle._M_fr_ptr + 0x4c8) = " == ";
      *(undefined8 *)((long)handle._M_fr_ptr + 0x4d0) = 5;
      *(bool *)((long)handle._M_fr_ptr + 0x4d8) = bVar20;
      if (!bVar20) {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
                  (&f,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
                   ,0x6cc,FAILED,"bufferStart == bufferEnd","_kjCondition,",
                   (DebugComparison<unsigned_long_&,_unsigned_long_&> *)
                   ((long)handle._M_fr_ptr + 0x4b8));
        kj::_::Debug::Fault::fatal(&f);
      }
      uVar10 = *(long *)(lVar13 + 0x38) - *(long *)(lVar13 + 0x18);
      *puVar1 = uVar10;
      *puVar2 = uVar10;
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)other,value_01);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::operator=(this_01,other);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(other);
      lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
      *(undefined8 *)(lVar13 + 0x38) = 0;
      *(undefined8 *)(lVar13 + 0x40) = 0;
LAB_0030eb08:
      co_await<unsigned_long>(__return_storage_ptr__,(Promise<unsigned_long> *)this_01);
      *(undefined1 *)((long)handle._M_fr_ptr + 0x55c) = 0;
      bVar20 = kj::_::PromiseAwaiterBase::awaitSuspendImpl
                         ((PromiseAwaiterBase *)__return_storage_ptr__,(CoroutineBase *)this_00);
      if (bVar20) {
        return (PromiseBase)(PromiseBase)this;
      }
      uVar6 = kj::_::PromiseAwaiter<unsigned_long>::await_resume(__return_storage_ptr__);
      kj::_::PromiseAwaiter<unsigned_long>::~PromiseAwaiter(__return_storage_ptr__);
      uVar10 = *(ulong *)((long)handle._M_fr_ptr + 0x528);
      lVar13 = *(long *)((long)handle._M_fr_ptr + 0x548);
      if (*(char *)(lVar13 + 0xd0) == '\0') {
        lVar12 = *(long *)(lVar13 + 0x18);
        uVar19 = uVar6;
      }
      else {
        uVar17 = uVar6;
        if ((uVar10 == *puVar1) && (*(char *)(*(long *)(lVar13 + 0x18) + uVar10) == '\r')) {
          uVar10 = uVar10 + 1;
          *puVar2 = uVar10;
          uVar17 = uVar6 - 1;
        }
        if (uVar17 == 0) {
LAB_0030ecfc:
          iVar14 = 5;
          goto LAB_0030ed01;
        }
        lVar12 = *(long *)(lVar13 + 0x18);
        uVar19 = uVar17;
        if (*(char *)(lVar12 + uVar10) == '\n') {
          *(undefined1 *)(lVar13 + 0xd0) = 0;
          uVar10 = uVar10 + 1;
          *puVar2 = uVar10;
          *puVar1 = uVar10;
          uVar19 = uVar17 - 1;
          if (uVar17 - 1 == 0) goto LAB_0030ecfc;
        }
      }
      uVar18 = uVar19 + uVar10;
      while (pvVar7 = memchr((void *)(lVar12 + uVar10),10,uVar18 - uVar10), pvVar7 != (void *)0x0) {
        if (*(int *)((long)handle._M_fr_ptr + 0x558) == 1) {
          lVar15 = (long)pvVar7 + (~(ulong)(*(char *)((long)pvVar7 + -1) == '\r') - lVar12) + 1;
          lVar13 = (long)pvVar7 + (1 - lVar12);
          lVar8 = *(long *)((long)handle._M_fr_ptr + 0x548);
LAB_0030ec7e:
          *(undefined1 *)(lVar8 + 0xd0) = 1;
LAB_0030ec85:
          lVar8 = *(long *)((long)handle._M_fr_ptr + 0x520);
          lVar5 = *(long *)((long)handle._M_fr_ptr + 0x548);
          *(long *)(lVar5 + 0x38) = lVar12 + lVar13;
          *(ulong *)(lVar5 + 0x40) = uVar18 - lVar13;
          *(undefined4 *)((long)handle._M_fr_ptr + 0x478) = 1;
          *(long *)((long)handle._M_fr_ptr + 0x480) = lVar12 + lVar8;
          *(long *)((long)handle._M_fr_ptr + 0x488) = lVar15 - lVar8;
          kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::fulfill
                    (this_00,value_00);
          uVar4 = value_00->tag;
          pFVar16 = value_00;
          goto LAB_0030ece2;
        }
        lVar8 = (long)pvVar7 - lVar12;
        if (3 < lVar8) {
          if (*(char *)((long)pvVar7 + -1) == '\r') {
            if (*(char *)((long)pvVar7 + -2) == '\n') {
              lStackY_260 = -2;
              goto LAB_0030ec63;
            }
          }
          else if (*(char *)((long)pvVar7 + -1) == '\n') {
            lStackY_260 = -1;
LAB_0030ec63:
            lVar13 = lVar8 + 1;
            lVar15 = lStackY_260 + lVar8 + 1;
            lVar8 = *(long *)((long)handle._M_fr_ptr + 0x548);
            if (*(int *)((long)handle._M_fr_ptr + 0x558) != 0) goto LAB_0030ec7e;
            if (*(long *)(lVar8 + 0x20) - uVar18 < 0x20) {
              count = *(long *)(lVar8 + 0x20) * 2;
              pcVar9 = kj::_::HeapArrayDisposer::allocate<char>(count);
              lVar12 = *(long *)((long)handle._M_fr_ptr + 0x548);
              *(char **)((long)handle._M_fr_ptr + 0x278) = pcVar9;
              *(size_t *)((long)handle._M_fr_ptr + 0x280) = count;
              *(undefined8 **)((long)handle._M_fr_ptr + 0x288) = &kj::_::HeapArrayDisposer::instance
              ;
              memcpy(pcVar9,*(void **)(lVar12 + 0x18),*(size_t *)(lVar12 + 0x20));
              Array<char>::operator=
                        ((Array<char> *)(lVar12 + 0x18),(Array<char> *)__return_storage_ptr__);
              lVar12 = *(long *)((long)handle._M_fr_ptr + 0x548);
              Array<char>::~Array((Array<char> *)__return_storage_ptr__);
              lVar12 = *(long *)(lVar12 + 0x18);
              lVar8 = *(long *)((long)handle._M_fr_ptr + 0x548);
            }
            *(long *)(lVar8 + 0x30) = lVar15;
            goto LAB_0030ec85;
          }
        }
        uVar10 = lVar8 + 1;
      }
      *puVar2 = uVar18;
      iVar14 = 0;
    }
LAB_0030ed01:
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(this_01);
    if ((iVar14 != 0) && (iVar14 != 5)) {
      if (iVar14 == 3) {
        *(undefined8 *)handle._M_fr_ptr = 0;
        *(undefined1 *)((long)handle._M_fr_ptr + 0x55c) = 1;
      }
      else {
        kj::_::Coroutine<kj::OneOf<kj::ArrayPtr<char>,_kj::HttpHeaders::ProtocolError>_>::~Coroutine
                  (this_00);
        operator_delete(handle._M_fr_ptr,0x560);
      }
      return (PromiseBase)(PromiseBase)this;
    }
  } while( true );
}

Assistant:

kj::Promise<kj::OneOf<kj::ArrayPtr<char>, HttpHeaders::ProtocolError>> readHeader(
      HeaderType type, size_t bufferStart, size_t bufferEnd) {
    // Reads the HTTP message header or a chunk header (as in transfer-encoding chunked) and
    // returns the buffer slice containing it.
    //
    // The main source of complication here is that we want to end up with one continuous buffer
    // containing the result, and that the input is delimited by newlines rather than by an upfront
    // length.

    for (;;) {
      kj::Promise<size_t> readPromise = nullptr;

      // Figure out where we're reading from.
      if (leftover != nullptr) {
        // Some data is still left over from the previous message, so start with that.

        // This can only happen if this is the initial run through the loop.
        KJ_ASSERT(bufferStart == bufferEnd);

        // OK, set bufferStart and bufferEnd to both point to the start of the leftover, and then
        // fake a read promise as if we read the bytes from the leftover.
        bufferStart = leftover.begin() - headerBuffer.begin();
        bufferEnd = bufferStart;
        readPromise = leftover.size();
        leftover = nullptr;
      } else {
        // Need to read more data from the underlying stream.

        if (bufferEnd == headerBuffer.size()) {
          // Out of buffer space.

          // Maybe we can move bufferStart backwards to make more space at the end?
          size_t minStart = type == HeaderType::MESSAGE ? 0 : messageHeaderEnd;

          if (bufferStart > minStart) {
            // Move to make space.
            memmove(headerBuffer.begin() + minStart, headerBuffer.begin() + bufferStart,
                    bufferEnd - bufferStart);
            bufferEnd = bufferEnd - bufferStart + minStart;
            bufferStart = minStart;
          } else {
            // Really out of buffer space. Grow the buffer.
            if (type != HeaderType::MESSAGE) {
              // Can't grow because we'd invalidate the HTTP headers.
              kj::throwFatalException(KJ_EXCEPTION(FAILED, "invalid HTTP chunk size"));
            }
            if (headerBuffer.size() >= MAX_BUFFER) {
              co_return HttpHeaders::ProtocolError {
                  .statusCode = 431,
                  .statusMessage = "Request Header Fields Too Large",
                  .description = "header too large.",
                  .rawContent = nullptr };
            }
            auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
            memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
            headerBuffer = kj::mv(newBuffer);
          }
        }

        // How many bytes will we read?
        size_t maxBytes = headerBuffer.size() - bufferEnd;

        if (type == HeaderType::CHUNK) {
          // Roughly limit the amount of data we read to MAX_CHUNK_HEADER_SIZE.
          // TODO(perf): This is mainly to avoid copying a lot of body data into our buffer just to
          //   copy it again when it is read. But maybe the copy would be cheaper than overhead of
          //   extra event loop turns?
          KJ_REQUIRE(bufferEnd - bufferStart <= MAX_CHUNK_HEADER_SIZE, "invalid HTTP chunk size");
          maxBytes = kj::min(maxBytes, MAX_CHUNK_HEADER_SIZE);
        }

        readPromise = inner.read(headerBuffer.begin() + bufferEnd, 1, maxBytes);
      }

      auto amount = co_await readPromise;

      if (lineBreakBeforeNextHeader) {
        // Hackily deal with expected leading line break.
        if (bufferEnd == bufferStart && headerBuffer[bufferEnd] == '\r') {
          ++bufferEnd;
          --amount;
        }

        if (amount > 0 && headerBuffer[bufferEnd] == '\n') {
          lineBreakBeforeNextHeader = false;
          ++bufferEnd;
          --amount;

          // Cut the leading line break out of the buffer entirely.
          bufferStart = bufferEnd;
        }

        if (amount == 0) {
          continue;
        }
      }

      size_t pos = bufferEnd;
      size_t newEnd = pos + amount;

      for (;;) {
        // Search for next newline.
        char* nl = reinterpret_cast<char*>(
            memchr(headerBuffer.begin() + pos, '\n', newEnd - pos));
        if (nl == nullptr) {
          // No newline found. Wait for more data.
          bufferEnd = newEnd;
          break;
        }

        // Is this newline which we found the last of the header? For a chunk header, always. For
        // a message header, we search for two newlines in a row. We accept either "\r\n" or just
        // "\n" as a newline sequence (though the standard requires "\r\n").
        if (type == HeaderType::CHUNK ||
            (nl - headerBuffer.begin() >= 4 &&
             ((nl[-1] == '\r' && nl[-2] == '\n') || (nl[-1] == '\n')))) {
          // OK, we've got all the data!

          size_t endIndex = nl + 1 - headerBuffer.begin();
          size_t leftoverStart = endIndex;

          // Strip off the last newline from end.
          endIndex -= 1 + (nl[-1] == '\r');

          if (type == HeaderType::MESSAGE) {
            if (headerBuffer.size() - newEnd < MAX_CHUNK_HEADER_SIZE) {
              // Ugh, there's not enough space for the secondary await buffer. Grow once more.
              auto newBuffer = kj::heapArray<char>(headerBuffer.size() * 2);
              memcpy(newBuffer.begin(), headerBuffer.begin(), headerBuffer.size());
              headerBuffer = kj::mv(newBuffer);
            }
            messageHeaderEnd = endIndex;
          } else {
            // For some reason, HTTP specifies that there will be a line break after each chunk.
            lineBreakBeforeNextHeader = true;
          }

          auto result = headerBuffer.slice(bufferStart, endIndex);
          leftover = headerBuffer.slice(leftoverStart, newEnd);
          co_return result;
        } else {
          pos = nl - headerBuffer.begin() + 1;
        }
      }

      // If we're here, we broke out of the inner loop because we need to read more data.
    }
  }